

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderCompilationCases.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles3::Performance::ShaderCompilerCase::iterate(ShaderCompilerCase *this)

{
  uint uVar1;
  TestContext *this_00;
  code *pcVar2;
  int iVar3;
  undefined4 vertShader;
  undefined4 fragShader;
  bool bVar4;
  deUint32 dVar5;
  TestLog *this_01;
  MessageBuilder *pMVar6;
  TestLog *pTVar7;
  size_type sVar8;
  char *pcVar9;
  deUint32 id;
  int precision;
  float fVar10;
  ShadersAndProgram SVar11;
  float local_3bc4;
  char *local_3778;
  MessageBuilder local_3770;
  allocator<char> local_35e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_35e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_35c8;
  allocator<char> local_35a1;
  string local_35a0 [8];
  string msg;
  undefined1 local_3558 [4];
  float result;
  vector<long,_std::allocator<long>_> local_33d8;
  allocator<char> local_33b9;
  string local_33b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3338;
  LogNumber<float> local_3318;
  vector<long,_std::allocator<long>_> local_32b0;
  allocator<char> local_3291;
  string local_3290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3210;
  LogNumber<float> local_31f0;
  vector<long,_std::allocator<long>_> local_3188;
  allocator<char> local_3169;
  string local_3168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30e8;
  LogNumber<float> local_30c8;
  vector<long,_std::allocator<long>_> local_3060;
  allocator<char> local_3041;
  string local_3040;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3020;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3000;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2fe0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2fc0;
  LogNumber<float> local_2fa0;
  vector<long,_std::allocator<long>_> local_2f38;
  allocator<char> local_2f19;
  string local_2f18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2ef8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2ed8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2eb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e98;
  LogNumber<float> local_2e78;
  vector<long,_std::allocator<long>_> local_2e10;
  allocator<char> local_2df1;
  string local_2df0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2dd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2db0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d70;
  LogNumber<float> local_2d50;
  vector<long,_std::allocator<long>_> local_2ce8;
  allocator<char> local_2cc9;
  string local_2cc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2ca8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c48;
  LogNumber<float> local_2c28;
  vector<long,_std::allocator<long>_> local_2bc0;
  allocator<char> local_2ba1;
  string local_2ba0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b20;
  LogNumber<float> local_2b00;
  char *local_2a98;
  MessageBuilder local_2a90;
  float local_2910;
  allocator<char> local_2909;
  float rangeSizeRatio;
  string statNamePrefix_1;
  undefined1 local_28e0 [3];
  bool isEntireRange_1;
  int entireRangeOrLowestHalf_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28c0;
  LogSection local_28a0;
  code *local_2860;
  VecFunc func;
  string plural;
  undefined1 local_2830 [8];
  string singular;
  undefined1 local_2808 [3];
  bool isMedian;
  int medianOrAverage;
  allocator<char> local_2681;
  string local_2680;
  allocator<char> local_2659;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2658;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2638;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2618;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_25f8;
  LogNumber<float> local_25d8;
  allocator<char> local_2569;
  string local_2568;
  allocator<char> local_2541;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2540;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2520;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2500;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_24e0;
  LogNumber<float> local_24c0;
  allocator<char> local_2451;
  string local_2450;
  allocator<char> local_2429;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2428;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_23e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_23c8;
  LogNumber<float> local_23a8;
  allocator<char> local_2339;
  string local_2338;
  allocator<char> local_2311;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_22f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_22d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_22b0;
  LogNumber<float> local_2290;
  allocator<char> local_2221;
  string local_2220;
  allocator<char> local_21f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_21f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_21d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_21b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2198;
  LogNumber<float> local_2178;
  allocator<char> local_2109;
  string local_2108;
  allocator<char> local_20e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_20e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_20c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_20a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2080;
  LogNumber<float> local_2060;
  allocator<char> local_1ff1;
  string local_1ff0;
  allocator<char> local_1fc9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1fc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1fa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f68;
  LogNumber<float> local_1f48;
  allocator<char> local_1ed9;
  string local_1ed8;
  allocator<char> local_1eb1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1eb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e50;
  LogNumber<float> local_1e30;
  allocator<char> local_1dc1;
  string local_1dc0;
  allocator<char> local_1d99;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d38;
  LogNumber<float> local_1d18;
  allocator<char> local_1ca9;
  string local_1ca8;
  allocator<char> local_1c81;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c20;
  LogNumber<float> local_1c00;
  allocator<char> local_1b91;
  string local_1b90;
  allocator<char> local_1b69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b08;
  LogNumber<float> local_1ae8;
  allocator<char> local_1a79;
  string local_1a78;
  allocator<char> local_1a51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_19f0;
  LogNumber<float> local_19d0;
  allocator<char> local_1961;
  string local_1960;
  allocator<char> local_1939;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1938;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1918;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_18f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_18d8;
  LogNumber<float> local_18b8;
  allocator<char> local_1849;
  string local_1848;
  allocator<char> local_1821;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1820;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1800;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_17e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_17c0;
  LogNumber<float> local_17a0;
  allocator<char> local_1731;
  string local_1730;
  allocator<char> local_1709;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1708;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_16e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_16c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_16a8;
  LogNumber<float> local_1688;
  allocator<char> local_1619;
  string local_1618;
  allocator<char> local_15f1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_15f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_15d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_15b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1590;
  LogNumber<float> local_1570;
  allocator<char> local_1501;
  string local_1500;
  allocator<char> local_14d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_14d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_14b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1498;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1478;
  LogNumber<float> local_1458;
  allocator<char> local_13e9;
  string local_13e8;
  allocator<char> local_13c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_13c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_13a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1360;
  LogNumber<float> local_1340;
  allocator<char> local_12d1;
  string local_12d0;
  allocator<char> local_12a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_12a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1248;
  LogNumber<float> local_1228;
  allocator<char> local_11b9;
  string local_11b8;
  allocator<char> local_1191;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1130;
  LogNumber<float> local_1110;
  char *local_10a8;
  MessageBuilder local_10a0;
  undefined1 local_f20 [8];
  vector<long,_std::allocator<long>_> rangeSpecializationTimes;
  vector<long,_std::allocator<long>_> rangeTotalTimes;
  undefined1 local_ee8 [8];
  string statNamePrefix;
  int local_ec0;
  bool isEntireRange;
  int entireRangeOrLowestHalf;
  string local_e98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e58;
  string local_e38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_df8;
  LogNumber<float> local_dd8;
  allocator<char> local_d69;
  string local_d68;
  string local_d48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d08;
  string local_ce8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ca8;
  LogNumber<float> local_c88;
  deInt64 local_c20;
  deInt64 local_c18;
  long local_c10;
  deInt64 specializationTime;
  deInt64 timeWithoutDraw;
  Measurement *curMeas;
  int ndx;
  allocator<char> local_bc9;
  string local_bc8;
  LogSection local_ba8;
  MessageBuilder local_b68;
  MessageBuilder local_9e8;
  MessageBuilder local_868;
  undefined1 local_6e8 [8];
  vector<long,_std::allocator<long>_> specializationTimes;
  vector<long,_std::allocator<long>_> totalTimesWithoutDraw;
  vector<long,_std::allocator<long>_> secondPhaseTimes;
  vector<long,_std::allocator<long>_> firstPhaseTimes;
  vector<long,_std::allocator<long>_> secondDrawTimes;
  vector<long,_std::allocator<long>_> secondInputTimes;
  vector<long,_std::allocator<long>_> firstDrawTimes;
  vector<long,_std::allocator<long>_> firstInputSetTimes;
  vector<long,_std::allocator<long>_> programLinkTimes;
  vector<long,_std::allocator<long>_> fragmentCompileTimes;
  vector<long,_std::allocator<long>_> vertexCompileTimes;
  vector<long,_std::allocator<long>_> sourceSetTimes;
  TestLog *log;
  Logs local_580;
  deUint64 local_520;
  deUint64 secondDrawEndTime;
  deUint64 secondShaderInputSetEndTime;
  deUint64 firstDrawEndTime;
  deUint64 firstShaderInputSetEndTime;
  deUint64 local_4a0;
  deUint64 programLinkEndTime;
  deUint64 fragmentShaderCompileEndTime;
  deUint64 vertexShaderCompileEndTime;
  deUint64 shaderSourceSetEndTime;
  deUint64 startTime;
  string local_458;
  uint local_434;
  undefined1 local_430 [4];
  deUint32 hash;
  BuildInfo buildInfo_1;
  undefined1 local_3b4 [8];
  ShadersAndProgram shadersAndProgram_1;
  ProgramContext progCtx_1;
  BuildInfo latestBuildInfo;
  ProgramContext latestProgramContext;
  vector<deqp::gles3::Performance::ShaderCompilerCase::Measurement,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::Measurement>_>
  measurements;
  Logs local_240;
  undefined1 local_1e0 [8];
  BuildInfo buildInfo;
  undefined1 local_168 [8];
  ShadersAndProgram shadersAndProgram;
  vector<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
  local_138;
  string local_120;
  string local_100;
  string local_d0;
  string local_b0;
  undefined1 local_90 [8];
  ProgramContext progCtx;
  deUint32 specID;
  ShaderCompilerCase *this_local;
  
  progCtx.uniforms.
  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = getSpecializationID(this,0);
  ProgramContext::ProgramContext((ProgramContext *)local_90);
  singleVaryingVertexTemplate_abi_cxx11_();
  specializeShaderSource
            (&local_b0,&local_d0,
             progCtx.uniforms.
             super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,SHADER_VALIDITY_VALID);
  std::__cxx11::string::operator=((string *)local_90,(string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  singleVaryingFragmentTemplate_abi_cxx11_();
  specializeShaderSource
            (&local_100,&local_120,
             progCtx.uniforms.
             super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,SHADER_VALIDITY_VALID);
  std::__cxx11::string::operator=
            ((string *)(progCtx.vertShaderSource.field_2._M_local_buf + 8),(string *)&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_120);
  getNameSpecialization_abi_cxx11_
            ((string *)&shadersAndProgram.program,
             (Performance *)
             (ulong)progCtx.uniforms.
                    super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,id);
  singleValueShaderAttributes(&local_138,(string *)&shadersAndProgram.program);
  std::
  vector<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
  ::operator=((vector<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
               *)((long)&progCtx.fragShaderSource.field_2 + 8),&local_138);
  std::
  vector<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::AttribSpec>_>
  ::~vector(&local_138);
  std::__cxx11::string::~string((string *)&shadersAndProgram.program);
  SVar11 = createShadersAndProgram(this);
  shadersAndProgram.vertShader = SVar11.program;
  buildInfo.logs.link.field_2._8_8_ = SVar11._0_8_;
  local_168._0_4_ = SVar11.vertShader;
  vertShader = local_168._0_4_;
  local_168._4_4_ = SVar11.fragShader;
  fragShader = local_168._4_4_;
  local_168 = (undefined1  [8])buildInfo.logs.link.field_2._8_8_;
  setShaderSources(this,vertShader,fragShader,(ProgramContext *)local_90);
  BuildInfo::BuildInfo((BuildInfo *)local_1e0);
  local_1e0[0] = compileShader(this,local_168._0_4_);
  local_1e0[1] = compileShader(this,local_168._4_4_);
  local_1e0[2] = linkAndUseProgram(this,shadersAndProgram.vertShader);
  if ((((local_1e0[0] & 1U) == 0) || ((local_1e0[1] & 1U) == 0)) || (!local_1e0[2])) {
    getLogs(&local_240,this,(ShadersAndProgram *)local_168);
    Logs::operator=((Logs *)&buildInfo,&local_240);
    Logs::~Logs(&local_240);
    logProgramData(this,(BuildInfo *)local_1e0,(ProgramContext *)local_90);
    cleanup(this,(EVP_PKEY_CTX *)local_168);
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Compilation failed");
    this_local._4_4_ = STOP;
    bVar4 = true;
  }
  else {
    setShaderInputs(this,shadersAndProgram.vertShader,(ProgramContext *)local_90);
    draw(this);
    cleanup(this,(EVP_PKEY_CTX *)local_168);
    bVar4 = false;
  }
  BuildInfo::~BuildInfo((BuildInfo *)local_1e0);
  ProgramContext::~ProgramContext((ProgramContext *)local_90);
  if (bVar4) {
    return this_local._4_4_;
  }
  std::
  vector<deqp::gles3::Performance::ShaderCompilerCase::Measurement,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::Measurement>_>
  ::vector((vector<deqp::gles3::Performance::ShaderCompilerCase::Measurement,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::Measurement>_>
            *)&latestProgramContext.uniforms.
               super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ProgramContext::ProgramContext((ProgramContext *)((long)&latestBuildInfo.logs.link.field_2 + 8));
  BuildInfo::BuildInfo
            ((BuildInfo *)
             &progCtx_1.uniforms.
              super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  while (bVar4 = goodEnoughMeasurements
                           (this,(vector<deqp::gles3::Performance::ShaderCompilerCase::Measurement,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::Measurement>_>
                                  *)&latestProgramContext.uniforms.
                                     super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage),
        ((bVar4 ^ 0xffU) & 1) != 0) {
    sVar8 = std::
            vector<deqp::gles3::Performance::ShaderCompilerCase::Measurement,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::Measurement>_>
            ::size((vector<deqp::gles3::Performance::ShaderCompilerCase::Measurement,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::Measurement>_>
                    *)&latestProgramContext.uniforms.
                       super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
              (&shadersAndProgram_1.fragShader,this,sVar8 & 0xffffffff);
    SVar11 = createShadersAndProgram(this);
    shadersAndProgram_1.vertShader = SVar11.program;
    buildInfo_1.logs.link.field_2._8_8_ = SVar11._0_8_;
    local_3b4 = (undefined1  [8])buildInfo_1.logs.link.field_2._8_8_;
    BuildInfo::BuildInfo((BuildInfo *)local_430);
    if ((this->m_addWhitespaceAndComments & 1U) != 0) {
      uVar1 = this->m_startHash;
      sVar8 = std::
              vector<deqp::gles3::Performance::ShaderCompilerCase::Measurement,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::Measurement>_>
              ::size((vector<deqp::gles3::Performance::ShaderCompilerCase::Measurement,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::Measurement>_>
                      *)&latestProgramContext.uniforms.
                         super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
      dVar5 = ::deInt32Hash((deInt32)sVar8);
      local_434 = uVar1 ^ dVar5;
      strWithWhiteSpaceAndComments(&local_458,(string *)&shadersAndProgram_1.fragShader,local_434);
      std::__cxx11::string::operator=
                ((string *)&shadersAndProgram_1.fragShader,(string *)&local_458);
      std::__cxx11::string::~string((string *)&local_458);
      strWithWhiteSpaceAndComments
                ((string *)&startTime,(string *)((long)&progCtx_1.vertShaderSource.field_2 + 8),
                 local_434);
      std::__cxx11::string::operator=
                ((string *)(progCtx_1.vertShaderSource.field_2._M_local_buf + 8),
                 (string *)&startTime);
      std::__cxx11::string::~string((string *)&startTime);
    }
    tcu::warmupCPU();
    shaderSourceSetEndTime = deGetMicroseconds();
    setShaderSources(this,local_3b4._0_4_,local_3b4._4_4_,
                     (ProgramContext *)&shadersAndProgram_1.fragShader);
    vertexShaderCompileEndTime = deGetMicroseconds();
    local_430[0] = compileShader(this,local_3b4._0_4_);
    fragmentShaderCompileEndTime = deGetMicroseconds();
    local_430[1] = compileShader(this,local_3b4._4_4_);
    programLinkEndTime = deGetMicroseconds();
    local_430[2] = linkAndUseProgram(this,shadersAndProgram_1.vertShader);
    local_4a0 = deGetMicroseconds();
    if ((((local_430[0] & 1U) == 0) || ((local_430[1] & 1U) == 0)) || ((local_430[2] & 1U) == 0)) {
      getLogs((Logs *)&firstShaderInputSetEndTime,this,(ShadersAndProgram *)local_3b4);
      Logs::operator=((Logs *)&buildInfo_1,(Logs *)&firstShaderInputSetEndTime);
      Logs::~Logs((Logs *)&firstShaderInputSetEndTime);
      logProgramData(this,(BuildInfo *)local_430,(ProgramContext *)&shadersAndProgram_1.fragShader);
      cleanup(this,(EVP_PKEY_CTX *)local_3b4);
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Compilation failed");
      this_local._4_4_ = STOP;
      bVar4 = true;
    }
    else {
      setShaderInputs(this,shadersAndProgram_1.vertShader,
                      (ProgramContext *)&shadersAndProgram_1.fragShader);
      firstDrawEndTime = deGetMicroseconds();
      draw(this);
      secondShaderInputSetEndTime = deGetMicroseconds();
      setShaderInputs(this,shadersAndProgram_1.vertShader,
                      (ProgramContext *)&shadersAndProgram_1.fragShader);
      secondDrawEndTime = deGetMicroseconds();
      draw(this);
      local_520 = deGetMicroseconds();
      getLogs(&local_580,this,(ShadersAndProgram *)local_3b4);
      Logs::operator=((Logs *)&buildInfo_1,&local_580);
      Logs::~Logs(&local_580);
      cleanup(this,(EVP_PKEY_CTX *)local_3b4);
      Measurement::Measurement
                ((Measurement *)&log,vertexShaderCompileEndTime - shaderSourceSetEndTime,
                 fragmentShaderCompileEndTime - vertexShaderCompileEndTime,
                 programLinkEndTime - fragmentShaderCompileEndTime,local_4a0 - programLinkEndTime,
                 firstDrawEndTime - local_4a0,secondShaderInputSetEndTime - firstDrawEndTime,
                 secondDrawEndTime - secondShaderInputSetEndTime,local_520 - secondDrawEndTime);
      std::
      vector<deqp::gles3::Performance::ShaderCompilerCase::Measurement,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::Measurement>_>
      ::push_back((vector<deqp::gles3::Performance::ShaderCompilerCase::Measurement,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::Measurement>_>
                   *)&latestProgramContext.uniforms.
                      super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)&log);
      BuildInfo::operator=
                ((BuildInfo *)
                 &progCtx_1.uniforms.
                  super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(BuildInfo *)local_430);
      ProgramContext::operator=
                ((ProgramContext *)((long)&latestBuildInfo.logs.link.field_2 + 8),
                 (ProgramContext *)&shadersAndProgram_1.fragShader);
      tcu::TestContext::touchWatchdog
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      bVar4 = false;
    }
    BuildInfo::~BuildInfo((BuildInfo *)local_430);
    ProgramContext::~ProgramContext((ProgramContext *)&shadersAndProgram_1.fragShader);
    if (bVar4) goto LAB_00bb7333;
  }
  this_01 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)
             &vertexCompileTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)
             &fragmentCompileTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)
             &programLinkTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)
             &firstInputSetTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)
             &firstDrawTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)
             &secondInputTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)
             &secondDrawTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)
             &firstPhaseTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)
             &secondPhaseTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)
             &totalTimesWithoutDraw.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)
             &specializationTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<long,_std::allocator<long>_>::vector((vector<long,_std::allocator<long>_> *)local_6e8)
  ;
  if ((this->m_avoidCache & 1U) == 0) {
    tcu::TestLog::operator<<(&local_868,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_868,
                        (char (*) [83])
                        "Note: Testing cache hits, so the medians and averages exclude the first iteration."
                       );
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_868);
  }
  tcu::TestLog::operator<<(&local_b68,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar6 = tcu::MessageBuilder::operator<<
                     (&local_b68,
                      (char (*) [74])
                      "Note: \"Specialization time\" means first draw time minus second draw time.")
  ;
  pTVar7 = tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::TestLog::operator<<(&local_9e8,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar6 = tcu::MessageBuilder::operator<<
                     (&local_9e8,
                      (char (*) [97])
                      "Note: \"Compilation time\" means the time up to (and including) linking, plus specialization time."
                     );
  tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_9e8);
  tcu::MessageBuilder::~MessageBuilder(&local_b68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_bc8,"IterationMeasurements",&local_bc9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ndx,"Iteration measurements of compilation and linking times",
             (allocator<char> *)((long)&curMeas + 7));
  tcu::LogSection::LogSection(&local_ba8,&local_bc8,(string *)&ndx);
  tcu::TestLog::operator<<(this_01,&local_ba8);
  tcu::LogSection::~LogSection(&local_ba8);
  std::__cxx11::string::~string((string *)&ndx);
  std::allocator<char>::~allocator((allocator<char> *)((long)&curMeas + 7));
  std::__cxx11::string::~string((string *)&local_bc8);
  std::allocator<char>::~allocator(&local_bc9);
  for (curMeas._0_4_ = 0; iVar3 = (int)curMeas,
      sVar8 = std::
              vector<deqp::gles3::Performance::ShaderCompilerCase::Measurement,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::Measurement>_>
              ::size((vector<deqp::gles3::Performance::ShaderCompilerCase::Measurement,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::Measurement>_>
                      *)&latestProgramContext.uniforms.
                         super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage), iVar3 < (int)sVar8;
      curMeas._0_4_ = (int)curMeas + 1) {
    timeWithoutDraw =
         (deInt64)std::
                  vector<deqp::gles3::Performance::ShaderCompilerCase::Measurement,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::Measurement>_>
                  ::operator[]((vector<deqp::gles3::Performance::ShaderCompilerCase::Measurement,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::Measurement>_>
                                *)&latestProgramContext.uniforms.
                                   super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (long)(int)curMeas);
    specializationTime = Measurement::totalTimeWithoutDraw((Measurement *)timeWithoutDraw);
    local_c10 = de::max<long>(0,*(long *)(timeWithoutDraw + 0x28) -
                                *(long *)(timeWithoutDraw + 0x38));
    if ((0 < (int)curMeas) || ((this->m_avoidCache & 1U) != 0)) {
      std::vector<long,_std::allocator<long>_>::push_back
                ((vector<long,_std::allocator<long>_> *)
                 &vertexCompileTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(value_type_conflict6 *)timeWithoutDraw)
      ;
      std::vector<long,_std::allocator<long>_>::push_back
                ((vector<long,_std::allocator<long>_> *)
                 &fragmentCompileTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,
                 (value_type_conflict6 *)(timeWithoutDraw + 8));
      std::vector<long,_std::allocator<long>_>::push_back
                ((vector<long,_std::allocator<long>_> *)
                 &programLinkTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,
                 (value_type_conflict6 *)(timeWithoutDraw + 0x10));
      std::vector<long,_std::allocator<long>_>::push_back
                ((vector<long,_std::allocator<long>_> *)
                 &firstInputSetTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,
                 (value_type_conflict6 *)(timeWithoutDraw + 0x18));
      std::vector<long,_std::allocator<long>_>::push_back
                ((vector<long,_std::allocator<long>_> *)
                 &firstDrawTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,
                 (value_type_conflict6 *)(timeWithoutDraw + 0x20));
      std::vector<long,_std::allocator<long>_>::push_back
                ((vector<long,_std::allocator<long>_> *)
                 &secondInputTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,
                 (value_type_conflict6 *)(timeWithoutDraw + 0x28));
      local_c18 = Measurement::firstPhase((Measurement *)timeWithoutDraw);
      std::vector<long,_std::allocator<long>_>::push_back
                ((vector<long,_std::allocator<long>_> *)
                 &secondPhaseTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,&local_c18);
      std::vector<long,_std::allocator<long>_>::push_back
                ((vector<long,_std::allocator<long>_> *)
                 &firstPhaseTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,
                 (value_type_conflict6 *)(timeWithoutDraw + 0x38));
      std::vector<long,_std::allocator<long>_>::push_back
                ((vector<long,_std::allocator<long>_> *)
                 &secondDrawTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,
                 (value_type_conflict6 *)(timeWithoutDraw + 0x30));
      local_c20 = Measurement::secondPhase((Measurement *)timeWithoutDraw);
      std::vector<long,_std::allocator<long>_>::push_back
                ((vector<long,_std::allocator<long>_> *)
                 &totalTimesWithoutDraw.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,&local_c20);
      std::vector<long,_std::allocator<long>_>::push_back
                ((vector<long,_std::allocator<long>_> *)
                 &specializationTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,&specializationTime);
      std::vector<long,_std::allocator<long>_>::push_back
                ((vector<long,_std::allocator<long>_> *)local_6e8,&local_c10);
    }
    de::toString<int>(&local_ce8,(int *)&curMeas);
    std::operator+(&local_cc8,"Measurement",&local_ce8);
    std::operator+(&local_ca8,&local_cc8,"CompilationTime");
    de::toString<int>(&local_d48,(int *)&curMeas);
    std::operator+(&local_d28,"Measurement ",&local_d48);
    std::operator+(&local_d08,&local_d28," compilation time");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_d68,"ms",&local_d69);
    tcu::LogNumber<float>::LogNumber
              (&local_c88,&local_ca8,&local_d08,&local_d68,QP_KEY_TAG_TIME,
               (float)specializationTime / 1000.0);
    pTVar7 = tcu::TestLog::operator<<(this_01,&local_c88);
    de::toString<int>(&local_e38,(int *)&curMeas);
    std::operator+(&local_e18,"Measurement",&local_e38);
    std::operator+(&local_df8,&local_e18,"SpecializationTime");
    de::toString<int>(&local_e98,(int *)&curMeas);
    std::operator+(&local_e78,"Measurement ",&local_e98);
    std::operator+(&local_e58,&local_e78," specialization time");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&entireRangeOrLowestHalf,"ms",(allocator<char> *)&isEntireRange);
    tcu::LogNumber<float>::LogNumber
              (&local_dd8,&local_df8,&local_e58,(string *)&entireRangeOrLowestHalf,QP_KEY_TAG_TIME,
               (float)local_c10 / 1000.0);
    tcu::TestLog::operator<<(pTVar7,&local_dd8);
    tcu::LogNumber<float>::~LogNumber(&local_dd8);
    std::__cxx11::string::~string((string *)&entireRangeOrLowestHalf);
    std::allocator<char>::~allocator((allocator<char> *)&isEntireRange);
    std::__cxx11::string::~string((string *)&local_e58);
    std::__cxx11::string::~string((string *)&local_e78);
    std::__cxx11::string::~string((string *)&local_e98);
    std::__cxx11::string::~string((string *)&local_df8);
    std::__cxx11::string::~string((string *)&local_e18);
    std::__cxx11::string::~string((string *)&local_e38);
    tcu::LogNumber<float>::~LogNumber(&local_c88);
    std::__cxx11::string::~string((string *)&local_d68);
    std::allocator<char>::~allocator(&local_d69);
    std::__cxx11::string::~string((string *)&local_d08);
    std::__cxx11::string::~string((string *)&local_d28);
    std::__cxx11::string::~string((string *)&local_d48);
    std::__cxx11::string::~string((string *)&local_ca8);
    std::__cxx11::string::~string((string *)&local_cc8);
    std::__cxx11::string::~string((string *)&local_ce8);
  }
  for (local_ec0 = 0; local_ec0 < 2; local_ec0 = local_ec0 + 1) {
    statNamePrefix.field_2._M_local_buf[0xf] = local_ec0 == 0;
    pcVar9 = "LowestHalf";
    if ((bool)statNamePrefix.field_2._M_local_buf[0xf]) {
      pcVar9 = "";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_ee8,pcVar9,
               (allocator<char> *)
               ((long)&rangeTotalTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&rangeTotalTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    if ((statNamePrefix.field_2._M_local_buf[0xf] & 1U) == 0) {
      vectorLowestPercentage<long>
                ((vector<long,_std::allocator<long>_> *)
                 &rangeSpecializationTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,
                 (vector<long,_std::allocator<long>_> *)
                 &specializationTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,0.5);
    }
    else {
      std::vector<long,_std::allocator<long>_>::vector
                ((vector<long,_std::allocator<long>_> *)
                 &rangeSpecializationTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,
                 (vector<long,_std::allocator<long>_> *)
                 &specializationTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
    }
    if ((statNamePrefix.field_2._M_local_buf[0xf] & 1U) == 0) {
      vectorLowestPercentage<long>
                ((vector<long,_std::allocator<long>_> *)local_f20,
                 (vector<long,_std::allocator<long>_> *)local_6e8,0.5);
    }
    else {
      std::vector<long,_std::allocator<long>_>::vector
                ((vector<long,_std::allocator<long>_> *)local_f20,
                 (vector<long,_std::allocator<long>_> *)local_6e8);
    }
    tcu::TestLog::operator<<(&local_10a0,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_10a0,(char (*) [27])"\nStatistics computed from ");
    local_10a8 = "only the lowest 50%";
    if ((statNamePrefix.field_2._M_local_buf[0xf] & 1U) != 0) {
      local_10a8 = "all";
    }
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_10a8);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [28])" of the above measurements:");
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_10a0);
    std::operator+(&local_1150,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_ee8,
                   "CompilationTime");
    std::operator+(&local_1130,&local_1150,"Median");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1190," of compilation time",&local_1191);
    std::operator+(&local_1170,"Median",&local_1190);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_11b8,"ms",&local_11b9);
    fVar10 = vectorFloatMedian<long>
                       ((vector<long,_std::allocator<long>_> *)
                        &rangeSpecializationTimes.super__Vector_base<long,_std::allocator<long>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage);
    tcu::LogNumber<float>::LogNumber
              (&local_1110,&local_1130,&local_1170,&local_11b8,QP_KEY_TAG_TIME,fVar10 / 1000.0);
    pTVar7 = tcu::TestLog::operator<<(this_01,&local_1110);
    std::operator+(&local_1268,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_ee8,
                   "SpecializationTime");
    std::operator+(&local_1248,&local_1268,"Median");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_12a8," of specialization time",&local_12a9);
    std::operator+(&local_1288,"Median",&local_12a8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_12d0,"ms",&local_12d1);
    fVar10 = vectorFloatMedian<long>((vector<long,_std::allocator<long>_> *)local_f20);
    tcu::LogNumber<float>::LogNumber
              (&local_1228,&local_1248,&local_1288,&local_12d0,QP_KEY_TAG_TIME,fVar10 / 1000.0);
    tcu::TestLog::operator<<(pTVar7,&local_1228);
    tcu::LogNumber<float>::~LogNumber(&local_1228);
    std::__cxx11::string::~string((string *)&local_12d0);
    std::allocator<char>::~allocator(&local_12d1);
    std::__cxx11::string::~string((string *)&local_1288);
    std::__cxx11::string::~string((string *)&local_12a8);
    std::allocator<char>::~allocator(&local_12a9);
    std::__cxx11::string::~string((string *)&local_1248);
    std::__cxx11::string::~string((string *)&local_1268);
    tcu::LogNumber<float>::~LogNumber(&local_1110);
    std::__cxx11::string::~string((string *)&local_11b8);
    std::allocator<char>::~allocator(&local_11b9);
    std::__cxx11::string::~string((string *)&local_1170);
    std::__cxx11::string::~string((string *)&local_1190);
    std::allocator<char>::~allocator(&local_1191);
    std::__cxx11::string::~string((string *)&local_1130);
    std::__cxx11::string::~string((string *)&local_1150);
    std::operator+(&local_1380,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_ee8,
                   "CompilationTime");
    std::operator+(&local_1360,&local_1380,"Average");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_13c0," of compilation time",&local_13c1);
    std::operator+(&local_13a0,"Average",&local_13c0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_13e8,"ms",&local_13e9);
    fVar10 = vectorFloatAverage<long>
                       ((vector<long,_std::allocator<long>_> *)
                        &rangeSpecializationTimes.super__Vector_base<long,_std::allocator<long>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage);
    tcu::LogNumber<float>::LogNumber
              (&local_1340,&local_1360,&local_13a0,&local_13e8,QP_KEY_TAG_TIME,fVar10 / 1000.0);
    pTVar7 = tcu::TestLog::operator<<(this_01,&local_1340);
    std::operator+(&local_1498,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_ee8,
                   "SpecializationTime");
    std::operator+(&local_1478,&local_1498,"Average");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_14d8," of specialization time",&local_14d9);
    std::operator+(&local_14b8,"Average",&local_14d8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1500,"ms",&local_1501);
    fVar10 = vectorFloatAverage<long>((vector<long,_std::allocator<long>_> *)local_f20);
    tcu::LogNumber<float>::LogNumber
              (&local_1458,&local_1478,&local_14b8,&local_1500,QP_KEY_TAG_TIME,fVar10 / 1000.0);
    tcu::TestLog::operator<<(pTVar7,&local_1458);
    tcu::LogNumber<float>::~LogNumber(&local_1458);
    std::__cxx11::string::~string((string *)&local_1500);
    std::allocator<char>::~allocator(&local_1501);
    std::__cxx11::string::~string((string *)&local_14b8);
    std::__cxx11::string::~string((string *)&local_14d8);
    std::allocator<char>::~allocator(&local_14d9);
    std::__cxx11::string::~string((string *)&local_1478);
    std::__cxx11::string::~string((string *)&local_1498);
    tcu::LogNumber<float>::~LogNumber(&local_1340);
    std::__cxx11::string::~string((string *)&local_13e8);
    std::allocator<char>::~allocator(&local_13e9);
    std::__cxx11::string::~string((string *)&local_13a0);
    std::__cxx11::string::~string((string *)&local_13c0);
    std::allocator<char>::~allocator(&local_13c1);
    std::__cxx11::string::~string((string *)&local_1360);
    std::__cxx11::string::~string((string *)&local_1380);
    std::operator+(&local_15b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_ee8,
                   "CompilationTime");
    std::operator+(&local_1590,&local_15b0,"Minimum");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_15f0," of compilation time",&local_15f1);
    std::operator+(&local_15d0,"Minimum",&local_15f0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1618,"ms",&local_1619);
    fVar10 = vectorFloatMinimum<long>
                       ((vector<long,_std::allocator<long>_> *)
                        &rangeSpecializationTimes.super__Vector_base<long,_std::allocator<long>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage);
    tcu::LogNumber<float>::LogNumber
              (&local_1570,&local_1590,&local_15d0,&local_1618,QP_KEY_TAG_TIME,fVar10 / 1000.0);
    pTVar7 = tcu::TestLog::operator<<(this_01,&local_1570);
    std::operator+(&local_16c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_ee8,
                   "SpecializationTime");
    std::operator+(&local_16a8,&local_16c8,"Minimum");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1708," of specialization time",&local_1709);
    std::operator+(&local_16e8,"Minimum",&local_1708);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1730,"ms",&local_1731);
    fVar10 = vectorFloatMinimum<long>((vector<long,_std::allocator<long>_> *)local_f20);
    tcu::LogNumber<float>::LogNumber
              (&local_1688,&local_16a8,&local_16e8,&local_1730,QP_KEY_TAG_TIME,fVar10 / 1000.0);
    tcu::TestLog::operator<<(pTVar7,&local_1688);
    tcu::LogNumber<float>::~LogNumber(&local_1688);
    std::__cxx11::string::~string((string *)&local_1730);
    std::allocator<char>::~allocator(&local_1731);
    std::__cxx11::string::~string((string *)&local_16e8);
    std::__cxx11::string::~string((string *)&local_1708);
    std::allocator<char>::~allocator(&local_1709);
    std::__cxx11::string::~string((string *)&local_16a8);
    std::__cxx11::string::~string((string *)&local_16c8);
    tcu::LogNumber<float>::~LogNumber(&local_1570);
    std::__cxx11::string::~string((string *)&local_1618);
    std::allocator<char>::~allocator(&local_1619);
    std::__cxx11::string::~string((string *)&local_15d0);
    std::__cxx11::string::~string((string *)&local_15f0);
    std::allocator<char>::~allocator(&local_15f1);
    std::__cxx11::string::~string((string *)&local_1590);
    std::__cxx11::string::~string((string *)&local_15b0);
    std::operator+(&local_17e0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_ee8,
                   "CompilationTime");
    std::operator+(&local_17c0,&local_17e0,"Maximum");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1820," of compilation time",&local_1821);
    std::operator+(&local_1800,"Maximum",&local_1820);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1848,"ms",&local_1849);
    fVar10 = vectorFloatMaximum<long>
                       ((vector<long,_std::allocator<long>_> *)
                        &rangeSpecializationTimes.super__Vector_base<long,_std::allocator<long>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage);
    tcu::LogNumber<float>::LogNumber
              (&local_17a0,&local_17c0,&local_1800,&local_1848,QP_KEY_TAG_TIME,fVar10 / 1000.0);
    pTVar7 = tcu::TestLog::operator<<(this_01,&local_17a0);
    std::operator+(&local_18f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_ee8,
                   "SpecializationTime");
    std::operator+(&local_18d8,&local_18f8,"Maximum");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1938," of specialization time",&local_1939);
    std::operator+(&local_1918,"Maximum",&local_1938);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1960,"ms",&local_1961);
    fVar10 = vectorFloatMaximum<long>((vector<long,_std::allocator<long>_> *)local_f20);
    tcu::LogNumber<float>::LogNumber
              (&local_18b8,&local_18d8,&local_1918,&local_1960,QP_KEY_TAG_TIME,fVar10 / 1000.0);
    tcu::TestLog::operator<<(pTVar7,&local_18b8);
    tcu::LogNumber<float>::~LogNumber(&local_18b8);
    std::__cxx11::string::~string((string *)&local_1960);
    std::allocator<char>::~allocator(&local_1961);
    std::__cxx11::string::~string((string *)&local_1918);
    std::__cxx11::string::~string((string *)&local_1938);
    std::allocator<char>::~allocator(&local_1939);
    std::__cxx11::string::~string((string *)&local_18d8);
    std::__cxx11::string::~string((string *)&local_18f8);
    tcu::LogNumber<float>::~LogNumber(&local_17a0);
    std::__cxx11::string::~string((string *)&local_1848);
    std::allocator<char>::~allocator(&local_1849);
    std::__cxx11::string::~string((string *)&local_1800);
    std::__cxx11::string::~string((string *)&local_1820);
    std::allocator<char>::~allocator(&local_1821);
    std::__cxx11::string::~string((string *)&local_17c0);
    std::__cxx11::string::~string((string *)&local_17e0);
    std::operator+(&local_1a10,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_ee8,
                   "CompilationTime");
    std::operator+(&local_19f0,&local_1a10,"MedianAbsoluteDeviation");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1a50," of compilation time",&local_1a51);
    std::operator+(&local_1a30,"Median absolute deviation",&local_1a50);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a78,"ms",&local_1a79);
    fVar10 = vectorFloatMedianAbsoluteDeviation<long>
                       ((vector<long,_std::allocator<long>_> *)
                        &rangeSpecializationTimes.super__Vector_base<long,_std::allocator<long>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage);
    tcu::LogNumber<float>::LogNumber
              (&local_19d0,&local_19f0,&local_1a30,&local_1a78,QP_KEY_TAG_TIME,fVar10 / 1000.0);
    pTVar7 = tcu::TestLog::operator<<(this_01,&local_19d0);
    std::operator+(&local_1b28,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_ee8,
                   "SpecializationTime");
    std::operator+(&local_1b08,&local_1b28,"MedianAbsoluteDeviation");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b68," of specialization time",&local_1b69);
    std::operator+(&local_1b48,"Median absolute deviation",&local_1b68);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b90,"ms",&local_1b91);
    fVar10 = vectorFloatMedianAbsoluteDeviation<long>
                       ((vector<long,_std::allocator<long>_> *)local_f20);
    tcu::LogNumber<float>::LogNumber
              (&local_1ae8,&local_1b08,&local_1b48,&local_1b90,QP_KEY_TAG_TIME,fVar10 / 1000.0);
    tcu::TestLog::operator<<(pTVar7,&local_1ae8);
    tcu::LogNumber<float>::~LogNumber(&local_1ae8);
    std::__cxx11::string::~string((string *)&local_1b90);
    std::allocator<char>::~allocator(&local_1b91);
    std::__cxx11::string::~string((string *)&local_1b48);
    std::__cxx11::string::~string((string *)&local_1b68);
    std::allocator<char>::~allocator(&local_1b69);
    std::__cxx11::string::~string((string *)&local_1b08);
    std::__cxx11::string::~string((string *)&local_1b28);
    tcu::LogNumber<float>::~LogNumber(&local_19d0);
    std::__cxx11::string::~string((string *)&local_1a78);
    std::allocator<char>::~allocator(&local_1a79);
    std::__cxx11::string::~string((string *)&local_1a30);
    std::__cxx11::string::~string((string *)&local_1a50);
    std::allocator<char>::~allocator(&local_1a51);
    std::__cxx11::string::~string((string *)&local_19f0);
    std::__cxx11::string::~string((string *)&local_1a10);
    std::operator+(&local_1c40,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_ee8,
                   "CompilationTime");
    std::operator+(&local_1c20,&local_1c40,"RelativeMedianAbsoluteDeviation");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c80," of compilation time",&local_1c81);
    std::operator+(&local_1c60,"Relative median absolute deviation",&local_1c80);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1ca8,"",&local_1ca9);
    fVar10 = vectorFloatRelativeMedianAbsoluteDeviation<long>
                       ((vector<long,_std::allocator<long>_> *)
                        &rangeSpecializationTimes.super__Vector_base<long,_std::allocator<long>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage);
    tcu::LogNumber<float>::LogNumber
              (&local_1c00,&local_1c20,&local_1c60,&local_1ca8,QP_KEY_TAG_NONE,fVar10);
    pTVar7 = tcu::TestLog::operator<<(this_01,&local_1c00);
    std::operator+(&local_1d58,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_ee8,
                   "SpecializationTime");
    std::operator+(&local_1d38,&local_1d58,"RelativeMedianAbsoluteDeviation");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d98," of specialization time",&local_1d99);
    std::operator+(&local_1d78,"Relative median absolute deviation",&local_1d98);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1dc0,"",&local_1dc1);
    fVar10 = vectorFloatRelativeMedianAbsoluteDeviation<long>
                       ((vector<long,_std::allocator<long>_> *)local_f20);
    tcu::LogNumber<float>::LogNumber
              (&local_1d18,&local_1d38,&local_1d78,&local_1dc0,QP_KEY_TAG_NONE,fVar10);
    tcu::TestLog::operator<<(pTVar7,&local_1d18);
    tcu::LogNumber<float>::~LogNumber(&local_1d18);
    std::__cxx11::string::~string((string *)&local_1dc0);
    std::allocator<char>::~allocator(&local_1dc1);
    std::__cxx11::string::~string((string *)&local_1d78);
    std::__cxx11::string::~string((string *)&local_1d98);
    std::allocator<char>::~allocator(&local_1d99);
    std::__cxx11::string::~string((string *)&local_1d38);
    std::__cxx11::string::~string((string *)&local_1d58);
    tcu::LogNumber<float>::~LogNumber(&local_1c00);
    std::__cxx11::string::~string((string *)&local_1ca8);
    std::allocator<char>::~allocator(&local_1ca9);
    std::__cxx11::string::~string((string *)&local_1c60);
    std::__cxx11::string::~string((string *)&local_1c80);
    std::allocator<char>::~allocator(&local_1c81);
    std::__cxx11::string::~string((string *)&local_1c20);
    std::__cxx11::string::~string((string *)&local_1c40);
    std::operator+(&local_1e70,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_ee8,
                   "CompilationTime");
    std::operator+(&local_1e50,&local_1e70,"StandardDeviation");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1eb0," of compilation time",&local_1eb1);
    std::operator+(&local_1e90,"Standard deviation",&local_1eb0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1ed8,"ms",&local_1ed9);
    fVar10 = vectorFloatStandardDeviation<long>
                       ((vector<long,_std::allocator<long>_> *)
                        &rangeSpecializationTimes.super__Vector_base<long,_std::allocator<long>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage);
    tcu::LogNumber<float>::LogNumber
              (&local_1e30,&local_1e50,&local_1e90,&local_1ed8,QP_KEY_TAG_TIME,fVar10 / 1000.0);
    pTVar7 = tcu::TestLog::operator<<(this_01,&local_1e30);
    std::operator+(&local_1f88,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_ee8,
                   "SpecializationTime");
    std::operator+(&local_1f68,&local_1f88,"StandardDeviation");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1fc8," of specialization time",&local_1fc9);
    std::operator+(&local_1fa8,"Standard deviation",&local_1fc8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1ff0,"ms",&local_1ff1);
    fVar10 = vectorFloatStandardDeviation<long>((vector<long,_std::allocator<long>_> *)local_f20);
    tcu::LogNumber<float>::LogNumber
              (&local_1f48,&local_1f68,&local_1fa8,&local_1ff0,QP_KEY_TAG_TIME,fVar10 / 1000.0);
    tcu::TestLog::operator<<(pTVar7,&local_1f48);
    tcu::LogNumber<float>::~LogNumber(&local_1f48);
    std::__cxx11::string::~string((string *)&local_1ff0);
    std::allocator<char>::~allocator(&local_1ff1);
    std::__cxx11::string::~string((string *)&local_1fa8);
    std::__cxx11::string::~string((string *)&local_1fc8);
    std::allocator<char>::~allocator(&local_1fc9);
    std::__cxx11::string::~string((string *)&local_1f68);
    std::__cxx11::string::~string((string *)&local_1f88);
    tcu::LogNumber<float>::~LogNumber(&local_1e30);
    std::__cxx11::string::~string((string *)&local_1ed8);
    std::allocator<char>::~allocator(&local_1ed9);
    std::__cxx11::string::~string((string *)&local_1e90);
    std::__cxx11::string::~string((string *)&local_1eb0);
    std::allocator<char>::~allocator(&local_1eb1);
    std::__cxx11::string::~string((string *)&local_1e50);
    std::__cxx11::string::~string((string *)&local_1e70);
    std::operator+(&local_20a0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_ee8,
                   "CompilationTime");
    std::operator+(&local_2080,&local_20a0,"RelativeStandardDeviation");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_20e0," of compilation time",&local_20e1);
    std::operator+(&local_20c0,"Relative standard deviation",&local_20e0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2108,"",&local_2109);
    fVar10 = vectorFloatRelativeStandardDeviation<long>
                       ((vector<long,_std::allocator<long>_> *)
                        &rangeSpecializationTimes.super__Vector_base<long,_std::allocator<long>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage);
    tcu::LogNumber<float>::LogNumber
              (&local_2060,&local_2080,&local_20c0,&local_2108,QP_KEY_TAG_NONE,fVar10);
    pTVar7 = tcu::TestLog::operator<<(this_01,&local_2060);
    std::operator+(&local_21b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_ee8,
                   "SpecializationTime");
    std::operator+(&local_2198,&local_21b8,"RelativeStandardDeviation");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_21f8," of specialization time",&local_21f9);
    std::operator+(&local_21d8,"Relative standard deviation",&local_21f8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2220,"",&local_2221);
    fVar10 = vectorFloatRelativeStandardDeviation<long>
                       ((vector<long,_std::allocator<long>_> *)local_f20);
    tcu::LogNumber<float>::LogNumber
              (&local_2178,&local_2198,&local_21d8,&local_2220,QP_KEY_TAG_NONE,fVar10);
    tcu::TestLog::operator<<(pTVar7,&local_2178);
    tcu::LogNumber<float>::~LogNumber(&local_2178);
    std::__cxx11::string::~string((string *)&local_2220);
    std::allocator<char>::~allocator(&local_2221);
    std::__cxx11::string::~string((string *)&local_21d8);
    std::__cxx11::string::~string((string *)&local_21f8);
    std::allocator<char>::~allocator(&local_21f9);
    std::__cxx11::string::~string((string *)&local_2198);
    std::__cxx11::string::~string((string *)&local_21b8);
    tcu::LogNumber<float>::~LogNumber(&local_2060);
    std::__cxx11::string::~string((string *)&local_2108);
    std::allocator<char>::~allocator(&local_2109);
    std::__cxx11::string::~string((string *)&local_20c0);
    std::__cxx11::string::~string((string *)&local_20e0);
    std::allocator<char>::~allocator(&local_20e1);
    std::__cxx11::string::~string((string *)&local_2080);
    std::__cxx11::string::~string((string *)&local_20a0);
    std::operator+(&local_22d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_ee8,
                   "CompilationTime");
    std::operator+(&local_22b0,&local_22d0,"MaxMinusMin");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2310," of compilation time",&local_2311);
    std::operator+(&local_22f0,"Max-min",&local_2310);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2338,"ms",&local_2339);
    fVar10 = vectorFloatMaximumMinusMinimum<long>
                       ((vector<long,_std::allocator<long>_> *)
                        &rangeSpecializationTimes.super__Vector_base<long,_std::allocator<long>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage);
    tcu::LogNumber<float>::LogNumber
              (&local_2290,&local_22b0,&local_22f0,&local_2338,QP_KEY_TAG_TIME,fVar10 / 1000.0);
    pTVar7 = tcu::TestLog::operator<<(this_01,&local_2290);
    std::operator+(&local_23e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_ee8,
                   "SpecializationTime");
    std::operator+(&local_23c8,&local_23e8,"MaxMinusMin");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2428," of specialization time",&local_2429);
    std::operator+(&local_2408,"Max-min",&local_2428);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2450,"ms",&local_2451);
    fVar10 = vectorFloatMaximumMinusMinimum<long>((vector<long,_std::allocator<long>_> *)local_f20);
    tcu::LogNumber<float>::LogNumber
              (&local_23a8,&local_23c8,&local_2408,&local_2450,QP_KEY_TAG_TIME,fVar10 / 1000.0);
    tcu::TestLog::operator<<(pTVar7,&local_23a8);
    tcu::LogNumber<float>::~LogNumber(&local_23a8);
    std::__cxx11::string::~string((string *)&local_2450);
    std::allocator<char>::~allocator(&local_2451);
    std::__cxx11::string::~string((string *)&local_2408);
    std::__cxx11::string::~string((string *)&local_2428);
    std::allocator<char>::~allocator(&local_2429);
    std::__cxx11::string::~string((string *)&local_23c8);
    std::__cxx11::string::~string((string *)&local_23e8);
    tcu::LogNumber<float>::~LogNumber(&local_2290);
    std::__cxx11::string::~string((string *)&local_2338);
    std::allocator<char>::~allocator(&local_2339);
    std::__cxx11::string::~string((string *)&local_22f0);
    std::__cxx11::string::~string((string *)&local_2310);
    std::allocator<char>::~allocator(&local_2311);
    std::__cxx11::string::~string((string *)&local_22b0);
    std::__cxx11::string::~string((string *)&local_22d0);
    std::operator+(&local_2500,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_ee8,
                   "CompilationTime");
    std::operator+(&local_24e0,&local_2500,"RelativeMaxMinusMin");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2540," of compilation time",&local_2541);
    std::operator+(&local_2520,"Relative max-min",&local_2540);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2568,"",&local_2569);
    fVar10 = vectorFloatRelativeMaximumMinusMinimum<long>
                       ((vector<long,_std::allocator<long>_> *)
                        &rangeSpecializationTimes.super__Vector_base<long,_std::allocator<long>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage);
    tcu::LogNumber<float>::LogNumber
              (&local_24c0,&local_24e0,&local_2520,&local_2568,QP_KEY_TAG_NONE,fVar10);
    pTVar7 = tcu::TestLog::operator<<(this_01,&local_24c0);
    std::operator+(&local_2618,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_ee8,
                   "SpecializationTime");
    std::operator+(&local_25f8,&local_2618,"RelativeMaxMinusMin");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2658," of specialization time",&local_2659);
    std::operator+(&local_2638,"Relative max-min",&local_2658);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2680,"",&local_2681);
    fVar10 = vectorFloatRelativeMaximumMinusMinimum<long>
                       ((vector<long,_std::allocator<long>_> *)local_f20);
    tcu::LogNumber<float>::LogNumber
              (&local_25d8,&local_25f8,&local_2638,&local_2680,QP_KEY_TAG_NONE,fVar10);
    tcu::TestLog::operator<<(pTVar7,&local_25d8);
    tcu::LogNumber<float>::~LogNumber(&local_25d8);
    std::__cxx11::string::~string((string *)&local_2680);
    std::allocator<char>::~allocator(&local_2681);
    std::__cxx11::string::~string((string *)&local_2638);
    std::__cxx11::string::~string((string *)&local_2658);
    std::allocator<char>::~allocator(&local_2659);
    std::__cxx11::string::~string((string *)&local_25f8);
    std::__cxx11::string::~string((string *)&local_2618);
    tcu::LogNumber<float>::~LogNumber(&local_24c0);
    std::__cxx11::string::~string((string *)&local_2568);
    std::allocator<char>::~allocator(&local_2569);
    std::__cxx11::string::~string((string *)&local_2520);
    std::__cxx11::string::~string((string *)&local_2540);
    std::allocator<char>::~allocator(&local_2541);
    std::__cxx11::string::~string((string *)&local_24e0);
    std::__cxx11::string::~string((string *)&local_2500);
    if (((statNamePrefix.field_2._M_local_buf[0xf] & 1U) == 0) &&
       (fVar10 = vectorFloatRelativeMedianAbsoluteDeviation<long>
                           ((vector<long,_std::allocator<long>_> *)
                            &rangeSpecializationTimes.
                             super__Vector_base<long,_std::allocator<long>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage), 0.05 < fVar10)) {
      tcu::TestLog::operator<<
                ((MessageBuilder *)local_2808,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar6 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_2808,
                          (char (*) [85])
                          "\nWARNING: couldn\'t achieve relative median absolute deviation under threshold value "
                         );
      pMVar6 = tcu::MessageBuilder::operator<<
                         (pMVar6,(float *)&RELATIVE_MEDIAN_ABSOLUTE_DEVIATION_THRESHOLD);
      pMVar6 = tcu::MessageBuilder::operator<<
                         (pMVar6,(char (*) [56])
                                 " for compilation time of the lowest 50% of measurements");
      tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_2808);
    }
    std::vector<long,_std::allocator<long>_>::~vector
              ((vector<long,_std::allocator<long>_> *)local_f20);
    std::vector<long,_std::allocator<long>_>::~vector
              ((vector<long,_std::allocator<long>_> *)
               &rangeSpecializationTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string((string *)local_ee8);
  }
  tcu::TestLog::operator<<(this_01,(EndSectionToken *)&tcu::TestLog::EndSection);
  for (singular.field_2._12_4_ = 0; (int)singular.field_2._12_4_ < 2;
      singular.field_2._12_4_ = singular.field_2._12_4_ + 1) {
    singular.field_2._M_local_buf[0xb] = singular.field_2._12_4_ == 0;
    pcVar9 = "Average";
    if ((bool)singular.field_2._M_local_buf[0xb]) {
      pcVar9 = "Median";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_2830,pcVar9,(allocator<char> *)(plural.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(plural.field_2._M_local_buf + 0xf));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&func,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2830,
                   "s");
    local_2860 = vectorFloatAverage<long>;
    if ((singular.field_2._M_local_buf[0xb] & 1U) != 0) {
      local_2860 = vectorFloatMedian<long>;
    }
    std::operator+(&local_28c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&func,
                   "PerPhase");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_28e0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&func,
                   " per phase");
    tcu::LogSection::LogSection(&local_28a0,&local_28c0,(string *)local_28e0);
    tcu::TestLog::operator<<(this_01,&local_28a0);
    tcu::LogSection::~LogSection(&local_28a0);
    std::__cxx11::string::~string((string *)local_28e0);
    std::__cxx11::string::~string((string *)&local_28c0);
    for (statNamePrefix_1.field_2._12_4_ = 0; (int)statNamePrefix_1.field_2._12_4_ < 2;
        statNamePrefix_1.field_2._12_4_ = statNamePrefix_1.field_2._12_4_ + 1) {
      statNamePrefix_1.field_2._M_local_buf[0xb] = statNamePrefix_1.field_2._12_4_ == 0;
      pcVar9 = "LowestHalf";
      if ((bool)statNamePrefix_1.field_2._M_local_buf[0xb]) {
        pcVar9 = "";
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&rangeSizeRatio,pcVar9,&local_2909);
      std::allocator<char>::~allocator(&local_2909);
      local_3bc4 = 1.0;
      if ((statNamePrefix_1.field_2._M_local_buf[0xb] & 1U) == 0) {
        local_3bc4 = 0.5;
      }
      local_2910 = local_3bc4;
      tcu::TestLog::operator<<(&local_2a90,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
      local_2a98 = "\nFor only the lowest 50% of the measurements:";
      if ((statNamePrefix_1.field_2._M_local_buf[0xb] & 1U) != 0) {
        local_2a98 = "For all measurements:";
      }
      pMVar6 = tcu::MessageBuilder::operator<<(&local_2a90,&local_2a98);
      tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_2a90);
      std::operator+(&local_2b40,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &rangeSizeRatio,"ShaderSourceSetTime");
      std::operator+(&local_2b20,&local_2b40,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2830
                    );
      std::operator+(&local_2b80,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2830
                     ," of ");
      std::operator+(&local_2b60,&local_2b80,"shader source set time");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_2ba0,"ms",&local_2ba1);
      pcVar2 = local_2860;
      vectorLowestPercentage<long>
                (&local_2bc0,
                 (vector<long,_std::allocator<long>_> *)
                 &vertexCompileTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,local_2910);
      fVar10 = (float)(*pcVar2)(&local_2bc0);
      tcu::LogNumber<float>::LogNumber
                (&local_2b00,&local_2b20,&local_2b60,&local_2ba0,QP_KEY_TAG_TIME,fVar10 / 1000.0);
      tcu::TestLog::operator<<(this_01,&local_2b00);
      tcu::LogNumber<float>::~LogNumber(&local_2b00);
      std::vector<long,_std::allocator<long>_>::~vector(&local_2bc0);
      std::__cxx11::string::~string((string *)&local_2ba0);
      std::allocator<char>::~allocator(&local_2ba1);
      std::__cxx11::string::~string((string *)&local_2b60);
      std::__cxx11::string::~string((string *)&local_2b80);
      std::__cxx11::string::~string((string *)&local_2b20);
      std::__cxx11::string::~string((string *)&local_2b40);
      std::operator+(&local_2c68,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &rangeSizeRatio,"VertexShaderCompileTime");
      std::operator+(&local_2c48,&local_2c68,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2830
                    );
      std::operator+(&local_2ca8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2830
                     ," of ");
      std::operator+(&local_2c88,&local_2ca8,"vertex shader compile time");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_2cc8,"ms",&local_2cc9);
      pcVar2 = local_2860;
      vectorLowestPercentage<long>
                (&local_2ce8,
                 (vector<long,_std::allocator<long>_> *)
                 &fragmentCompileTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,local_2910);
      fVar10 = (float)(*pcVar2)(&local_2ce8);
      tcu::LogNumber<float>::LogNumber
                (&local_2c28,&local_2c48,&local_2c88,&local_2cc8,QP_KEY_TAG_TIME,fVar10 / 1000.0);
      tcu::TestLog::operator<<(this_01,&local_2c28);
      tcu::LogNumber<float>::~LogNumber(&local_2c28);
      std::vector<long,_std::allocator<long>_>::~vector(&local_2ce8);
      std::__cxx11::string::~string((string *)&local_2cc8);
      std::allocator<char>::~allocator(&local_2cc9);
      std::__cxx11::string::~string((string *)&local_2c88);
      std::__cxx11::string::~string((string *)&local_2ca8);
      std::__cxx11::string::~string((string *)&local_2c48);
      std::__cxx11::string::~string((string *)&local_2c68);
      std::operator+(&local_2d90,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &rangeSizeRatio,"FragmentShaderCompileTime");
      std::operator+(&local_2d70,&local_2d90,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2830
                    );
      std::operator+(&local_2dd0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2830
                     ," of ");
      std::operator+(&local_2db0,&local_2dd0,"fragment shader compile time");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_2df0,"ms",&local_2df1);
      pcVar2 = local_2860;
      vectorLowestPercentage<long>
                (&local_2e10,
                 (vector<long,_std::allocator<long>_> *)
                 &programLinkTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,local_2910);
      fVar10 = (float)(*pcVar2)(&local_2e10);
      tcu::LogNumber<float>::LogNumber
                (&local_2d50,&local_2d70,&local_2db0,&local_2df0,QP_KEY_TAG_TIME,fVar10 / 1000.0);
      tcu::TestLog::operator<<(this_01,&local_2d50);
      tcu::LogNumber<float>::~LogNumber(&local_2d50);
      std::vector<long,_std::allocator<long>_>::~vector(&local_2e10);
      std::__cxx11::string::~string((string *)&local_2df0);
      std::allocator<char>::~allocator(&local_2df1);
      std::__cxx11::string::~string((string *)&local_2db0);
      std::__cxx11::string::~string((string *)&local_2dd0);
      std::__cxx11::string::~string((string *)&local_2d70);
      std::__cxx11::string::~string((string *)&local_2d90);
      std::operator+(&local_2eb8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &rangeSizeRatio,"ProgramLinkTime");
      std::operator+(&local_2e98,&local_2eb8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2830
                    );
      std::operator+(&local_2ef8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2830
                     ," of ");
      std::operator+(&local_2ed8,&local_2ef8,"program link time");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f18,"ms",&local_2f19);
      pcVar2 = local_2860;
      vectorLowestPercentage<long>
                (&local_2f38,
                 (vector<long,_std::allocator<long>_> *)
                 &firstInputSetTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,local_2910);
      fVar10 = (float)(*pcVar2)(&local_2f38);
      tcu::LogNumber<float>::LogNumber
                (&local_2e78,&local_2e98,&local_2ed8,&local_2f18,QP_KEY_TAG_TIME,fVar10 / 1000.0);
      tcu::TestLog::operator<<(this_01,&local_2e78);
      tcu::LogNumber<float>::~LogNumber(&local_2e78);
      std::vector<long,_std::allocator<long>_>::~vector(&local_2f38);
      std::__cxx11::string::~string((string *)&local_2f18);
      std::allocator<char>::~allocator(&local_2f19);
      std::__cxx11::string::~string((string *)&local_2ed8);
      std::__cxx11::string::~string((string *)&local_2ef8);
      std::__cxx11::string::~string((string *)&local_2e98);
      std::__cxx11::string::~string((string *)&local_2eb8);
      std::operator+(&local_2fe0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &rangeSizeRatio,"FirstShaderInputSetTime");
      std::operator+(&local_2fc0,&local_2fe0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2830
                    );
      std::operator+(&local_3020,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2830
                     ," of ");
      std::operator+(&local_3000,&local_3020,"first shader input set time");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_3040,"ms",&local_3041);
      pcVar2 = local_2860;
      vectorLowestPercentage<long>
                (&local_3060,
                 (vector<long,_std::allocator<long>_> *)
                 &firstDrawTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,local_2910);
      fVar10 = (float)(*pcVar2)(&local_3060);
      tcu::LogNumber<float>::LogNumber
                (&local_2fa0,&local_2fc0,&local_3000,&local_3040,QP_KEY_TAG_TIME,fVar10 / 1000.0);
      tcu::TestLog::operator<<(this_01,&local_2fa0);
      tcu::LogNumber<float>::~LogNumber(&local_2fa0);
      std::vector<long,_std::allocator<long>_>::~vector(&local_3060);
      std::__cxx11::string::~string((string *)&local_3040);
      std::allocator<char>::~allocator(&local_3041);
      std::__cxx11::string::~string((string *)&local_3000);
      std::__cxx11::string::~string((string *)&local_3020);
      std::__cxx11::string::~string((string *)&local_2fc0);
      std::__cxx11::string::~string((string *)&local_2fe0);
      std::operator+(&local_3108,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &rangeSizeRatio,"FirstDrawTime");
      std::operator+(&local_30e8,&local_3108,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2830
                    );
      std::operator+(&local_3148,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2830
                     ," of ");
      std::operator+(&local_3128,&local_3148,"first draw time");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_3168,"ms",&local_3169);
      pcVar2 = local_2860;
      vectorLowestPercentage<long>
                (&local_3188,
                 (vector<long,_std::allocator<long>_> *)
                 &secondInputTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,local_2910);
      fVar10 = (float)(*pcVar2)(&local_3188);
      tcu::LogNumber<float>::LogNumber
                (&local_30c8,&local_30e8,&local_3128,&local_3168,QP_KEY_TAG_TIME,fVar10 / 1000.0);
      tcu::TestLog::operator<<(this_01,&local_30c8);
      tcu::LogNumber<float>::~LogNumber(&local_30c8);
      std::vector<long,_std::allocator<long>_>::~vector(&local_3188);
      std::__cxx11::string::~string((string *)&local_3168);
      std::allocator<char>::~allocator(&local_3169);
      std::__cxx11::string::~string((string *)&local_3128);
      std::__cxx11::string::~string((string *)&local_3148);
      std::__cxx11::string::~string((string *)&local_30e8);
      std::__cxx11::string::~string((string *)&local_3108);
      std::operator+(&local_3230,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &rangeSizeRatio,"SecondShaderInputSetTime");
      std::operator+(&local_3210,&local_3230,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2830
                    );
      std::operator+(&local_3270,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2830
                     ," of ");
      std::operator+(&local_3250,&local_3270,"second shader input set time");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_3290,"ms",&local_3291);
      pcVar2 = local_2860;
      vectorLowestPercentage<long>
                (&local_32b0,
                 (vector<long,_std::allocator<long>_> *)
                 &secondDrawTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,local_2910);
      fVar10 = (float)(*pcVar2)(&local_32b0);
      tcu::LogNumber<float>::LogNumber
                (&local_31f0,&local_3210,&local_3250,&local_3290,QP_KEY_TAG_TIME,fVar10 / 1000.0);
      tcu::TestLog::operator<<(this_01,&local_31f0);
      tcu::LogNumber<float>::~LogNumber(&local_31f0);
      std::vector<long,_std::allocator<long>_>::~vector(&local_32b0);
      std::__cxx11::string::~string((string *)&local_3290);
      std::allocator<char>::~allocator(&local_3291);
      std::__cxx11::string::~string((string *)&local_3250);
      std::__cxx11::string::~string((string *)&local_3270);
      std::__cxx11::string::~string((string *)&local_3210);
      std::__cxx11::string::~string((string *)&local_3230);
      std::operator+(&local_3358,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &rangeSizeRatio,"SecondDrawTime");
      std::operator+(&local_3338,&local_3358,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2830
                    );
      std::operator+(&local_3398,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2830
                     ," of ");
      std::operator+(&local_3378,&local_3398,"second draw time");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_33b8,"ms",&local_33b9);
      pcVar2 = local_2860;
      vectorLowestPercentage<long>
                (&local_33d8,
                 (vector<long,_std::allocator<long>_> *)
                 &firstPhaseTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,local_2910);
      fVar10 = (float)(*pcVar2)(&local_33d8);
      tcu::LogNumber<float>::LogNumber
                (&local_3318,&local_3338,&local_3378,&local_33b8,QP_KEY_TAG_TIME,fVar10 / 1000.0);
      tcu::TestLog::operator<<(this_01,&local_3318);
      tcu::LogNumber<float>::~LogNumber(&local_3318);
      std::vector<long,_std::allocator<long>_>::~vector(&local_33d8);
      std::__cxx11::string::~string((string *)&local_33b8);
      std::allocator<char>::~allocator(&local_33b9);
      std::__cxx11::string::~string((string *)&local_3378);
      std::__cxx11::string::~string((string *)&local_3398);
      std::__cxx11::string::~string((string *)&local_3338);
      std::__cxx11::string::~string((string *)&local_3358);
      std::__cxx11::string::~string((string *)&rangeSizeRatio);
    }
    tcu::TestLog::operator<<(this_01,(EndSectionToken *)&tcu::TestLog::EndSection);
    std::__cxx11::string::~string((string *)&func);
    std::__cxx11::string::~string((string *)local_2830);
  }
  tcu::TestLog::operator<<
            ((MessageBuilder *)local_3558,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar6 = tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)local_3558,
                      (char (*) [110])
                      "Note: test result is the first quartile (i.e. median of the lowest half of measurements) of compilation times"
                     );
  tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_3558);
  fVar10 = vectorFloatFirstQuartile<long>
                     ((vector<long,_std::allocator<long>_> *)
                      &specializationTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
  this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
  de::floatToString_abi_cxx11_
            ((string *)((long)&msg.field_2 + 8),(de *)0x2,fVar10 / 1000.0,precision);
  pcVar9 = (char *)std::__cxx11::string::c_str();
  tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_PASS,pcVar9);
  std::__cxx11::string::~string((string *)(msg.field_2._M_local_buf + 8));
  if (((this->m_avoidCache & 1U) != 0) || ((this->m_addWhitespaceAndComments & 1U) != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_35a0,"Note: the following shaders are the ones from the last iteration; ",
               &local_35a1);
    std::allocator<char>::~allocator(&local_35a1);
    if ((this->m_avoidCache & 1U) != 0) {
      std::__cxx11::string::operator+=(local_35a0,"variables\' names and some constant expressions")
      ;
    }
    if ((this->m_addWhitespaceAndComments & 1U) != 0) {
      pcVar9 = "";
      if ((this->m_avoidCache & 1U) != 0) {
        pcVar9 = " as well as ";
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_35e8,pcVar9,&local_35e9);
      std::operator+(&local_35c8,&local_35e8,"whitespace and comments");
      std::__cxx11::string::operator+=(local_35a0,(string *)&local_35c8);
      std::__cxx11::string::~string((string *)&local_35c8);
      std::__cxx11::string::~string((string *)&local_35e8);
      std::allocator<char>::~allocator(&local_35e9);
    }
    std::__cxx11::string::operator+=(local_35a0," differ between iterations.");
    tcu::TestLog::operator<<(&local_3770,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
    local_3778 = (char *)std::__cxx11::string::c_str();
    pMVar6 = tcu::MessageBuilder::operator<<(&local_3770,&local_3778);
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_3770);
    std::__cxx11::string::~string(local_35a0);
  }
  logProgramData(this,(BuildInfo *)
                      &progCtx_1.uniforms.
                       super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (ProgramContext *)((long)&latestBuildInfo.logs.link.field_2 + 8));
  this_local._4_4_ = STOP;
  std::vector<long,_std::allocator<long>_>::~vector
            ((vector<long,_std::allocator<long>_> *)local_6e8);
  std::vector<long,_std::allocator<long>_>::~vector
            ((vector<long,_std::allocator<long>_> *)
             &specializationTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<long,_std::allocator<long>_>::~vector
            ((vector<long,_std::allocator<long>_> *)
             &totalTimesWithoutDraw.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<long,_std::allocator<long>_>::~vector
            ((vector<long,_std::allocator<long>_> *)
             &secondPhaseTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<long,_std::allocator<long>_>::~vector
            ((vector<long,_std::allocator<long>_> *)
             &firstPhaseTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<long,_std::allocator<long>_>::~vector
            ((vector<long,_std::allocator<long>_> *)
             &secondDrawTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<long,_std::allocator<long>_>::~vector
            ((vector<long,_std::allocator<long>_> *)
             &secondInputTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<long,_std::allocator<long>_>::~vector
            ((vector<long,_std::allocator<long>_> *)
             &firstDrawTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<long,_std::allocator<long>_>::~vector
            ((vector<long,_std::allocator<long>_> *)
             &firstInputSetTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<long,_std::allocator<long>_>::~vector
            ((vector<long,_std::allocator<long>_> *)
             &programLinkTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<long,_std::allocator<long>_>::~vector
            ((vector<long,_std::allocator<long>_> *)
             &fragmentCompileTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<long,_std::allocator<long>_>::~vector
            ((vector<long,_std::allocator<long>_> *)
             &vertexCompileTimes.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
LAB_00bb7333:
  BuildInfo::~BuildInfo
            ((BuildInfo *)
             &progCtx_1.uniforms.
              super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ProgramContext::~ProgramContext((ProgramContext *)((long)&latestBuildInfo.logs.link.field_2 + 8));
  std::
  vector<deqp::gles3::Performance::ShaderCompilerCase::Measurement,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::Measurement>_>
  ::~vector((vector<deqp::gles3::Performance::ShaderCompilerCase::Measurement,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::Measurement>_>
             *)&latestProgramContext.uniforms.
                super__Vector_base<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec,_std::allocator<deqp::gles3::Performance::ShaderCompilerCase::UniformSpec>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return this_local._4_4_;
}

Assistant:

ShaderCompilerCase::IterateResult ShaderCompilerCase::iterate (void)
{
	// Before actual measurements, compile and draw with a dummy shader to avoid possible initial slowdowns in the actual test.
	{
		deUint32		specID = getSpecializationID(0);
		ProgramContext	progCtx;
		progCtx.vertShaderSource = specializeShaderSource(singleVaryingVertexTemplate(), specID, SHADER_VALIDITY_VALID);
		progCtx.fragShaderSource = specializeShaderSource(singleVaryingFragmentTemplate(), specID, SHADER_VALIDITY_VALID);
		progCtx.vertexAttributes = singleValueShaderAttributes(getNameSpecialization(specID));

		ShadersAndProgram shadersAndProgram = createShadersAndProgram();
		setShaderSources(shadersAndProgram.vertShader, shadersAndProgram.fragShader, progCtx);

		BuildInfo buildInfo;
		buildInfo.vertCompileSuccess	= compileShader(shadersAndProgram.vertShader);
		buildInfo.fragCompileSuccess	= compileShader(shadersAndProgram.fragShader);
		buildInfo.linkSuccess			= linkAndUseProgram(shadersAndProgram.program);
		if (!(buildInfo.vertCompileSuccess && buildInfo.fragCompileSuccess && buildInfo.linkSuccess))
		{
			buildInfo.logs = getLogs(shadersAndProgram);
			logProgramData(buildInfo, progCtx);
			cleanup(shadersAndProgram, progCtx, buildInfo.linkSuccess);
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Compilation failed");
			return STOP;
		}
		setShaderInputs(shadersAndProgram.program, progCtx);
		draw();
		cleanup(shadersAndProgram, progCtx, buildInfo.linkSuccess);
	}

	vector<Measurement>		measurements;
	// \note These are logged after measurements are done.
	ProgramContext			latestProgramContext;
	BuildInfo				latestBuildInfo;

	if (WARMUP_CPU_AT_BEGINNING_OF_CASE)
		tcu::warmupCPU();

	// Actual test measurements.
	while (!goodEnoughMeasurements(measurements))
	{
		// Create shaders, compile & link, set shader inputs and draw. Time measurement is done at relevant points.
		// \note Setting inputs and drawing are done twice in order to find out the time for actual compiling.

		// \note Shader data (sources and inputs) are generated and GL shader and program objects are created before any time measurements.
		ProgramContext		progCtx				= generateShaderData((int)measurements.size());
		ShadersAndProgram	shadersAndProgram	= createShadersAndProgram();
		BuildInfo			buildInfo;

		if (m_addWhitespaceAndComments)
		{
			const deUint32 hash = m_startHash ^ (deUint32)deInt32Hash((deInt32)measurements.size());
			progCtx.vertShaderSource = strWithWhiteSpaceAndComments(progCtx.vertShaderSource, hash);
			progCtx.fragShaderSource = strWithWhiteSpaceAndComments(progCtx.fragShaderSource, hash);
		}

		if (WARMUP_CPU_BEFORE_EACH_MEASUREMENT)
			tcu::warmupCPU();

		// \note Do NOT do anything too hefty between the first and last deGetMicroseconds() here (other than the gl calls); it would disturb the measurement.

		deUint64 startTime = deGetMicroseconds();

		setShaderSources(shadersAndProgram.vertShader, shadersAndProgram.fragShader, progCtx);
		deUint64 shaderSourceSetEndTime = deGetMicroseconds();

		buildInfo.vertCompileSuccess = compileShader(shadersAndProgram.vertShader);
		deUint64 vertexShaderCompileEndTime = deGetMicroseconds();

		buildInfo.fragCompileSuccess = compileShader(shadersAndProgram.fragShader);
		deUint64 fragmentShaderCompileEndTime = deGetMicroseconds();

		buildInfo.linkSuccess = linkAndUseProgram(shadersAndProgram.program);
		deUint64 programLinkEndTime = deGetMicroseconds();

		// Check compilation and linking status here, after all compilation and linking gl calls are made.
		if (!(buildInfo.vertCompileSuccess && buildInfo.fragCompileSuccess && buildInfo.linkSuccess))
		{
			buildInfo.logs = getLogs(shadersAndProgram);
			logProgramData(buildInfo, progCtx);
			cleanup(shadersAndProgram, progCtx, buildInfo.linkSuccess);
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Compilation failed");
			return STOP;
		}

		setShaderInputs(shadersAndProgram.program, progCtx);
		deUint64 firstShaderInputSetEndTime = deGetMicroseconds();

		// Draw for the first time.
		draw();
		deUint64 firstDrawEndTime = deGetMicroseconds();

		// Set inputs and draw again.

		setShaderInputs(shadersAndProgram.program, progCtx);
		deUint64 secondShaderInputSetEndTime = deGetMicroseconds();

		draw();
		deUint64 secondDrawEndTime = deGetMicroseconds();

		// De-initializations (detach shaders etc.).

		buildInfo.logs = getLogs(shadersAndProgram);
		cleanup(shadersAndProgram, progCtx, buildInfo.linkSuccess);

		// Output measurement log later (after last measurement).

		measurements.push_back(Measurement((deInt64)(shaderSourceSetEndTime			- startTime),
										   (deInt64)(vertexShaderCompileEndTime		- shaderSourceSetEndTime),
										   (deInt64)(fragmentShaderCompileEndTime	- vertexShaderCompileEndTime),
										   (deInt64)(programLinkEndTime				- fragmentShaderCompileEndTime),
										   (deInt64)(firstShaderInputSetEndTime		- programLinkEndTime),
										   (deInt64)(firstDrawEndTime				- firstShaderInputSetEndTime),
										   (deInt64)(secondShaderInputSetEndTime	- firstDrawEndTime),
										   (deInt64)(secondDrawEndTime				- secondShaderInputSetEndTime)));

		latestBuildInfo			= buildInfo;
		latestProgramContext	= progCtx;

		m_testCtx.touchWatchdog(); // \note Measurements may take a while in a bad case.
	}

	// End of test case, log information about measurements.
	{
		TestLog& log = m_testCtx.getLog();

		vector<deInt64> sourceSetTimes;
		vector<deInt64> vertexCompileTimes;
		vector<deInt64> fragmentCompileTimes;
		vector<deInt64> programLinkTimes;
		vector<deInt64> firstInputSetTimes;
		vector<deInt64> firstDrawTimes;
		vector<deInt64> secondInputTimes;
		vector<deInt64> secondDrawTimes;
		vector<deInt64> firstPhaseTimes;
		vector<deInt64> secondPhaseTimes;
		vector<deInt64> totalTimesWithoutDraw;
		vector<deInt64> specializationTimes;

		if (!m_avoidCache)
			log << TestLog::Message << "Note: Testing cache hits, so the medians and averages exclude the first iteration." << TestLog::EndMessage;

		log << TestLog::Message << "Note: \"Specialization time\" means first draw time minus second draw time." << TestLog::EndMessage
			<< TestLog::Message << "Note: \"Compilation time\" means the time up to (and including) linking, plus specialization time." << TestLog::EndMessage;

		log << TestLog::Section("IterationMeasurements", "Iteration measurements of compilation and linking times");

		DE_ASSERT((int)measurements.size() > (m_avoidCache ? 0 : 1));

		for (int ndx = 0; ndx < (int)measurements.size(); ndx++)
		{
			const Measurement& curMeas = measurements[ndx];

			// Subtract time of second phase (second input setup and draw) from first (from start to end of first draw).
			// \note Cap if second phase seems unreasonably high (higher than first input set and draw).
			deInt64 timeWithoutDraw		= curMeas.totalTimeWithoutDraw();

			// Specialization time = first draw - second draw time. Again, cap at 0 if second draw was longer than first draw.
			deInt64 specializationTime	= de::max<deInt64>(0, curMeas.firstDrawTime - curMeas.secondDrawTime);

			if (ndx > 0 || m_avoidCache) // \note When allowing cache hits, don't account for the first measurement when calculating median or average.
			{
				sourceSetTimes.push_back		(curMeas.sourceSetTime);
				vertexCompileTimes.push_back	(curMeas.vertexCompileTime);
				fragmentCompileTimes.push_back	(curMeas.fragmentCompileTime);
				programLinkTimes.push_back		(curMeas.programLinkTime);
				firstInputSetTimes.push_back	(curMeas.firstInputSetTime);
				firstDrawTimes.push_back		(curMeas.firstDrawTime);
				firstPhaseTimes.push_back		(curMeas.firstPhase());
				secondDrawTimes.push_back		(curMeas.secondDrawTime);
				secondInputTimes.push_back		(curMeas.secondInputSetTime);
				secondPhaseTimes.push_back		(curMeas.secondPhase());
				totalTimesWithoutDraw.push_back	(timeWithoutDraw);
				specializationTimes.push_back	(specializationTime);
			}

			// Log this measurement.
			log << TestLog::Float("Measurement" + de::toString(ndx) + "CompilationTime",
								  "Measurement " + de::toString(ndx) + " compilation time",
								  "ms", QP_KEY_TAG_TIME, (float)timeWithoutDraw / 1000.0f)
				<< TestLog::Float("Measurement" + de::toString(ndx) + "SpecializationTime",
								  "Measurement " + de::toString(ndx) + " specialization time",
								  "ms", QP_KEY_TAG_TIME, (float)specializationTime / 1000.0f);
		}

		// Log some statistics.

		for (int entireRangeOrLowestHalf = 0; entireRangeOrLowestHalf < 2; entireRangeOrLowestHalf++)
		{
			bool				isEntireRange				= entireRangeOrLowestHalf == 0;
			string				statNamePrefix				= isEntireRange ? "" : "LowestHalf";
			vector<deInt64>		rangeTotalTimes				= isEntireRange ? totalTimesWithoutDraw	: vectorLowestPercentage(totalTimesWithoutDraw,	0.5f);
			vector<deInt64>		rangeSpecializationTimes	= isEntireRange ? specializationTimes	: vectorLowestPercentage(specializationTimes,	0.5f);

#define LOG_COMPILE_SPECIALIZE_TIME_STAT(NAME, DESC, FUNC)																													\
	log << TestLog::Float(statNamePrefix + "CompilationTime" + (NAME), (DESC) + string(" of compilation time"), "ms", QP_KEY_TAG_TIME, (FUNC)(rangeTotalTimes)/1000.0f)		\
		<< TestLog::Float(statNamePrefix + "SpecializationTime" + (NAME), (DESC) + string(" of specialization time"), "ms", QP_KEY_TAG_TIME, (FUNC)(rangeSpecializationTimes)/1000.0f)

#define LOG_COMPILE_SPECIALIZE_RELATIVE_STAT(NAME, DESC, FUNC)																										\
	log << TestLog::Float(statNamePrefix + "CompilationTime" + (NAME), (DESC) + string(" of compilation time"), "", QP_KEY_TAG_NONE, (FUNC)(rangeTotalTimes))		\
		<< TestLog::Float(statNamePrefix + "SpecializationTime" + (NAME), (DESC) + string(" of specialization time"), "", QP_KEY_TAG_NONE, (FUNC)(rangeSpecializationTimes))

			log << TestLog::Message << "\nStatistics computed from "
									<< (isEntireRange ? "all" : "only the lowest 50%")
									<< " of the above measurements:"
									<< TestLog::EndMessage;

			LOG_COMPILE_SPECIALIZE_TIME_STAT		("Median",							"Median",								vectorFloatMedian);
			LOG_COMPILE_SPECIALIZE_TIME_STAT		("Average",							"Average",								vectorFloatAverage);
			LOG_COMPILE_SPECIALIZE_TIME_STAT		("Minimum",							"Minimum",								vectorFloatMinimum);
			LOG_COMPILE_SPECIALIZE_TIME_STAT		("Maximum",							"Maximum",								vectorFloatMaximum);
			LOG_COMPILE_SPECIALIZE_TIME_STAT		("MedianAbsoluteDeviation",			"Median absolute deviation",			vectorFloatMedianAbsoluteDeviation);
			LOG_COMPILE_SPECIALIZE_RELATIVE_STAT	("RelativeMedianAbsoluteDeviation",	"Relative median absolute deviation",	vectorFloatRelativeMedianAbsoluteDeviation);
			LOG_COMPILE_SPECIALIZE_TIME_STAT		("StandardDeviation",				"Standard deviation",					vectorFloatStandardDeviation);
			LOG_COMPILE_SPECIALIZE_RELATIVE_STAT	("RelativeStandardDeviation",		"Relative standard deviation",			vectorFloatRelativeStandardDeviation);
			LOG_COMPILE_SPECIALIZE_TIME_STAT		("MaxMinusMin",						"Max-min",								vectorFloatMaximumMinusMinimum);
			LOG_COMPILE_SPECIALIZE_RELATIVE_STAT	("RelativeMaxMinusMin",				"Relative max-min",						vectorFloatRelativeMaximumMinusMinimum);

#undef LOG_COMPILE_SPECIALIZE_RELATIVE_STAT
#undef LOG_COMPILE_SPECIALIZE_TIME_STAT

			if (!isEntireRange && vectorFloatRelativeMedianAbsoluteDeviation(rangeTotalTimes) > RELATIVE_MEDIAN_ABSOLUTE_DEVIATION_THRESHOLD)
				log << TestLog::Message << "\nWARNING: couldn't achieve relative median absolute deviation under threshold value "
										<< RELATIVE_MEDIAN_ABSOLUTE_DEVIATION_THRESHOLD
										<< " for compilation time of the lowest 50% of measurements" << TestLog::EndMessage;
		}

		log << TestLog::EndSection; // End section IterationMeasurements

		for (int medianOrAverage = 0; medianOrAverage < 2; medianOrAverage++)
		{
			typedef float (*VecFunc)(const vector<deInt64>&);

			bool	isMedian						= medianOrAverage == 0;
			string	singular						= isMedian ? "Median" : "Average";
			string	plural							= singular + "s";
			VecFunc func							= isMedian ? (VecFunc) vectorFloatMedian<deInt64> : (VecFunc) vectorFloatAverage<deInt64>;

			log << TestLog::Section(plural + "PerPhase", plural + " per phase");

			for (int entireRangeOrLowestHalf = 0; entireRangeOrLowestHalf < 2; entireRangeOrLowestHalf++)
			{
				bool	isEntireRange	= entireRangeOrLowestHalf == 0;
				string	statNamePrefix	= isEntireRange ? "" : "LowestHalf";
				float	rangeSizeRatio	= isEntireRange ? 1.0f : 0.5f;

#define LOG_TIME(NAME, DESC, DATA) log << TestLog::Float(statNamePrefix + (NAME) + singular, singular + " of " + (DESC), "ms", QP_KEY_TAG_TIME, func(vectorLowestPercentage((DATA), rangeSizeRatio))/1000.0f);

				log << TestLog::Message << (isEntireRange ? "For all measurements:" : "\nFor only the lowest 50% of the measurements:") << TestLog::EndMessage;
				LOG_TIME("ShaderSourceSetTime",			"shader source set time",			sourceSetTimes);
				LOG_TIME("VertexShaderCompileTime",		"vertex shader compile time",		vertexCompileTimes);
				LOG_TIME("FragmentShaderCompileTime",	"fragment shader compile time",		fragmentCompileTimes);
				LOG_TIME("ProgramLinkTime",				"program link time",				programLinkTimes);
				LOG_TIME("FirstShaderInputSetTime",		"first shader input set time",		firstInputSetTimes);
				LOG_TIME("FirstDrawTime",				"first draw time",					firstDrawTimes);
				LOG_TIME("SecondShaderInputSetTime",	"second shader input set time",		secondInputTimes);
				LOG_TIME("SecondDrawTime",				"second draw time",					secondDrawTimes);

#undef LOG_TIME
			}

			log << TestLog::EndSection;
		}

		// Set result.

		{
			log << TestLog::Message << "Note: test result is the first quartile (i.e. median of the lowest half of measurements) of compilation times" << TestLog::EndMessage;
			float result = vectorFloatFirstQuartile(totalTimesWithoutDraw) / 1000.0f;
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, de::floatToString(result, 2).c_str());
		}

		// Log shaders.

		if (m_avoidCache || m_addWhitespaceAndComments)
		{
			string msg = "Note: the following shaders are the ones from the last iteration; ";

			if (m_avoidCache)
				msg += "variables' names and some constant expressions";
			if (m_addWhitespaceAndComments)
				msg += string(m_avoidCache ? " as well as " : "") + "whitespace and comments";

			msg += " differ between iterations.";

			log << TestLog::Message << msg.c_str() << TestLog::EndMessage;
		}

		logProgramData(latestBuildInfo, latestProgramContext);

		return STOP;
	}
}